

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

string * rcg::getEnum(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *list,bool exception)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  ulong uVar6;
  gcstring *this;
  char *pcVar7;
  invalid_argument *piVar8;
  char *in_RDX;
  string *in_RDI;
  byte in_R8B;
  GenericException *ex;
  IEnumEntry *entry;
  size_t i;
  StringList_t entries;
  IEnumeration *val;
  INode *node;
  string *ret;
  value_type *in_stack_fffffffffffffcc8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffcd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd8;
  long *local_2a0;
  allocator local_249;
  string local_248 [32];
  string local_228 [38];
  undefined1 local_202;
  allocator local_201;
  string local_200 [32];
  string local_1e0 [38];
  undefined1 local_1ba;
  allocator local_1b9;
  string local_1b8 [32];
  string local_198 [38];
  undefined1 local_172;
  allocator local_171;
  string local_170 [32];
  string local_150 [32];
  gcstring local_130 [80];
  long *local_e0;
  allocator local_d1;
  string local_d0 [32];
  ulong local_b0;
  gcstring_vector local_a8 [16];
  long *local_98;
  gcstring local_80 [80];
  long local_30;
  undefined1 local_22;
  byte local_21;
  char *local_18;
  long lVar5;
  
  local_21 = in_R8B & 1;
  local_22 = 0;
  local_18 = in_RDX;
  std::__cxx11::string::string(in_RDI);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x134060);
  peVar4 = std::
           __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x13406d);
  GenICam_3_4::gcstring::gcstring(local_80,local_18);
  iVar3 = (*(peVar4->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar4,local_80);
  lVar5 = CONCAT44(extraout_var,iVar3);
  GenICam_3_4::gcstring::~gcstring(local_80);
  local_30 = lVar5;
  if (lVar5 == 0) {
    if ((local_21 & 1) != 0) {
      piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_248,"Feature not found: ",&local_249);
      std::operator+(in_stack_fffffffffffffcd8,(char *)in_stack_fffffffffffffcd0);
      std::invalid_argument::invalid_argument(piVar8,local_228);
      __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    bVar2 = GenApi_3_4::IsReadable((IBase *)in_stack_fffffffffffffcd0);
    if (bVar2) {
      if (local_30 == 0) {
        local_2a0 = (long *)0x0;
      }
      else {
        local_2a0 = (long *)__dynamic_cast(local_30,&GenApi_3_4::INode::typeinfo,
                                           &GenApi_3_4::IEnumeration::typeinfo,0xfffffffffffffffe);
      }
      local_98 = local_2a0;
      if (local_2a0 == (long *)0x0) {
        if ((local_21 & 1) != 0) {
          local_1ba = 1;
          piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1b8,"Feature not enumeration: ",&local_1b9);
          std::operator+(in_stack_fffffffffffffcd8,(char *)in_stack_fffffffffffffcd0);
          std::invalid_argument::invalid_argument(piVar8,local_198);
          local_1ba = 0;
          __cxa_throw(piVar8,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      else {
        GenICam_3_4::gcstring_vector::gcstring_vector(local_a8);
        (**(code **)(*local_98 + 0x38))(local_98,local_a8);
        for (local_b0 = 0; uVar1 = local_b0, uVar6 = GenICam_3_4::gcstring_vector::size(),
            uVar1 < uVar6; local_b0 = local_b0 + 1) {
          this = (gcstring *)GenICam_3_4::gcstring_vector::operator[]((ulong)local_a8);
          pcVar7 = GenICam_3_4::gcstring::operator_cast_to_char_(this);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_d0,pcVar7,&local_d1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
          std::__cxx11::string::~string(local_d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        }
        local_e0 = (long *)(**(code **)(*local_98 + 0x78))(local_98,0);
        if (local_e0 == (long *)0x0) {
          if ((local_21 & 1) != 0) {
            local_172 = 1;
            piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_170,"Current value is not defined: ",&local_171);
            std::operator+(in_stack_fffffffffffffcd8,(char *)in_stack_fffffffffffffcd0);
            std::invalid_argument::invalid_argument(piVar8,local_150);
            local_172 = 0;
            __cxa_throw(piVar8,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
        }
        else {
          (**(code **)(*local_e0 + 0x40))(local_130);
          pcVar7 = GenICam_3_4::gcstring::operator_cast_to_char_(local_130);
          std::__cxx11::string::operator=(in_RDI,pcVar7);
          GenICam_3_4::gcstring::~gcstring(local_130);
        }
        GenICam_3_4::gcstring_vector::~gcstring_vector(local_a8);
      }
    }
    else if ((local_21 & 1) != 0) {
      local_202 = 1;
      piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_200,"Feature not readable: ",&local_201);
      std::operator+(in_stack_fffffffffffffcd8,(char *)in_stack_fffffffffffffcd0);
      std::invalid_argument::invalid_argument(piVar8,local_1e0);
      local_202 = 0;
      __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  return in_RDI;
}

Assistant:

std::string getEnum(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
                    std::vector<std::string> &list, bool exception)
{
  std::string ret;

  list.clear();

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsReadable(node))
      {
        GenApi::IEnumeration *val=dynamic_cast<GenApi::IEnumeration *>(node);

        if (val != 0)
        {
          GenApi::StringList_t entries;
          val->GetSymbolics(entries);

          for (size_t i=0; i<entries.size(); i++)
          {
            list.push_back(std::string(entries[i]));
          }

          GenApi::IEnumEntry *entry=val->GetCurrentEntry();

          if (entry != 0)
          {
            ret=entry->GetSymbolic();
          }
          else if (exception)
          {
            throw std::invalid_argument(std::string("Current value is not defined: ")+name);
          }
        }
        else if (exception)
        {
          throw std::invalid_argument(std::string("Feature not enumeration: ")+name);
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not readable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}